

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatawidgetmapper.cpp
# Opt level: O0

int __thiscall QDataWidgetMapper::mappedSection(QDataWidgetMapper *this,QWidget *widget)

{
  int iVar1;
  const_reference pvVar2;
  size_type in_RSI;
  vector<QDataWidgetMapperPrivate::WidgetMapper,_std::allocator<QDataWidgetMapperPrivate::WidgetMapper>_>
  *in_RDI;
  int idx;
  QDataWidgetMapperPrivate *d;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  d_func((QDataWidgetMapper *)0x87115c);
  iVar1 = QDataWidgetMapperPrivate::findWidget
                    ((QDataWidgetMapperPrivate *)
                     CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),(QWidget *)this);
  if (iVar1 == -1) {
    iVar1 = -1;
  }
  else {
    pvVar2 = std::
             vector<QDataWidgetMapperPrivate::WidgetMapper,_std::allocator<QDataWidgetMapperPrivate::WidgetMapper>_>
             ::operator[](in_RDI,in_RSI);
    iVar1 = pvVar2->section;
  }
  return iVar1;
}

Assistant:

int QDataWidgetMapper::mappedSection(QWidget *widget) const
{
    Q_D(const QDataWidgetMapper);

    int idx = d->findWidget(widget);
    if (idx == -1)
        return -1;

    return d->widgetMap[idx].section;
}